

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cors.cpp
# Opt level: O0

Url * __thiscall Vault::Sys::Cors::getUrl_abi_cxx11_(Url *__return_storage_ptr__,Cors *this)

{
  long *plVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_39;
  string local_38 [32];
  Cors *local_18;
  Cors *this_local;
  
  plVar1 = *(long **)this;
  local_18 = this;
  this_local = (Cors *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"/v1/sys/config/cors",&local_39);
  local_78.field_2._M_allocated_capacity = 0;
  local_78.field_2._8_8_ = 0;
  local_78._M_dataplus = (_Alloc_hider)0x0;
  local_78._1_7_ = 0;
  local_78._M_string_length = 0;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny((Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_78);
  (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,local_38,&local_78);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny((Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_78);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Sys::Cors::getUrl() {
  return client_.getUrl("/v1/sys/config/cors", Path{});
}